

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void if_expr(Vm *vm)

{
  Scanner *scanner;
  Compiler *pCVar1;
  Token *pTVar2;
  uint64_t uVar3;
  uint64_t address;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  TokenType TVar9;
  undefined4 uVar10;
  TokenType TVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  Token local_50;
  
  TVar9 = (vm->compiler).token.type;
  uVar10 = *(undefined4 *)&(vm->compiler).token.field_0x4;
  pcVar4 = (vm->compiler).token.start;
  uVar7 = (vm->compiler).token.line;
  uVar8 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  TVar11 = (vm->compiler).next.type;
  uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x4;
  pcVar5 = (vm->compiler).next.start;
  sVar6 = (vm->compiler).next.length;
  uVar13 = (vm->compiler).next.line;
  uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar7;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar8;
  (vm->compiler).previous.type = TVar9;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar10;
  (vm->compiler).previous.start = pcVar4;
  (vm->compiler).token.type = TVar11;
  *(undefined4 *)&(vm->compiler).token.field_0x4 = uVar12;
  (vm->compiler).token.start = pcVar5;
  (vm->compiler).token.length = sVar6;
  (vm->compiler).token.line = uVar13;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
  scanner = &(vm->compiler).scanner;
  scan_token(&local_50,scanner);
  (vm->compiler).next.length = local_50.length;
  (vm->compiler).next.line = local_50.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
  (vm->compiler).next.type = local_50.type;
  *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
  (vm->compiler).next.start = local_50.start;
  expr(vm);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,')');
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
  uVar3 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
  block_expr(vm);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'&');
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
  address = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
  patch_jump_to(vm,uVar3 - 2,address);
  if ((vm->compiler).token.type == TOKEN_ELSE) {
    pCVar1 = &vm->compiler;
    pTVar2 = &(vm->compiler).next;
    TVar9 = (pCVar1->token).type;
    uVar10 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar7 = (vm->compiler).token.line;
    uVar8 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar7;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar8;
    (vm->compiler).previous.type = TVar9;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar10;
    (vm->compiler).previous.start = pcVar4;
    uVar8 = *(undefined4 *)&pTVar2->field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar6 = (vm->compiler).next.length;
    uVar7 = (vm->compiler).next.line;
    uVar10 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = pTVar2->type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar8;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar6;
    (vm->compiler).token.line = uVar7;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar10;
    scan_token(&local_50,scanner);
    (vm->compiler).next.length = local_50.length;
    (vm->compiler).next.line = local_50.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
    pTVar2->type = local_50.type;
    *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
    (vm->compiler).next.start = local_50.start;
    if ((pCVar1->token).type == TOKEN_IF) {
      if_expr(vm);
    }
    else {
      block_expr(vm);
    }
  }
  else {
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x03');
  }
  patch_jump_to(vm,address - 2,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count
               );
  return;
}

Assistant:

static void if_expr(Vm *vm) {
    advance(vm);
    expr(vm);

    uint64_t false_jump = emit_jump(vm, OP_JMF);
    block_expr(vm);

    uint64_t exit_jump = emit_jump(vm, OP_JMP);
    patch_jump(vm, false_jump);

    if (vm->compiler.token.type == TOKEN_ELSE) {
        advance(vm);
        if (vm->compiler.token.type == TOKEN_IF) {
            if_expr(vm);
        } else {
            block_expr(vm);
        }
    } else {
        emit_no_arg(vm, OP_NIL);
    }
    patch_jump(vm, exit_jump);
}